

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall
qpdf::Stream::pipeStreamData
          (Stream *this,Pipeline *pipeline,bool *filterp,int encode_flags,
          qpdf_stream_decode_level_e decode_level,bool suppress_warnings,bool will_retry)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *length;
  __shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool *pbVar2;
  bool bVar3;
  int iVar4;
  __shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  element_type *peVar7;
  uchar *puVar8;
  size_t sVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  runtime_error *this_03;
  qpdf_offset_t qVar13;
  logic_error *this_04;
  QPDF *qpdf;
  element_type *peVar14;
  element_type *peVar15;
  bool local_529;
  Pl_Flate *local_4c8;
  int local_440;
  int local_43c;
  bool local_435;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  QPDFObjectHandle local_3a0;
  QPDFObjGen local_390;
  QPDFObjectHandle local_388;
  allocator<char> local_371;
  string local_370;
  undefined1 local_349;
  string local_348;
  string local_328;
  QPDFObjGen local_308;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  string local_218 [32];
  QPDFObjectHandle local_1f8;
  byte local_1e3;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  long local_1c0;
  qpdf_offset_t desired_length;
  qpdf_offset_t actual_length;
  QPDFObjGen local_1a8;
  undefined1 local_1a0 [8];
  Pl_Count count;
  function<void_(const_char_*,_int)> local_160;
  Pl_Flate *local_140;
  Pl_Flate *flate;
  Pipeline *decode_pipeline;
  undefined1 local_128 [8];
  reverse_iterator f_iter;
  undefined1 local_108 [16];
  reverse_iterator iter;
  shared_ptr<Pl_QPDFTokenizer> local_f0;
  shared_ptr<ContentNormalizer> local_e0;
  undefined4 local_cc;
  shared_ptr<Pl_Flate> local_c8;
  undefined1 local_b8 [8];
  shared_ptr<Pipeline> new_pipeline;
  shared_ptr<ContentNormalizer> normalizer;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  bool local_69;
  bool success;
  bool *filter;
  undefined1 local_58 [5];
  bool ignored;
  bool lossy_compression;
  bool specialized_compression;
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  filters;
  Members *s;
  bool will_retry_local;
  bool suppress_warnings_local;
  qpdf_stream_decode_level_e decode_level_local;
  int encode_flags_local;
  bool *filterp_local;
  Pipeline *pipeline_local;
  Stream *this_local;
  
  filterp_local = (bool *)pipeline;
  pipeline_local = (Pipeline *)this;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)stream(this);
  std::
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>::
  vector((vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
          *)local_58);
  filter._7_1_ = 0;
  filter._6_1_ = 0;
  _decode_level_local = filterp;
  if (filterp == (bool *)0x0) {
    _decode_level_local = (bool *)((long)&filter + 5);
  }
  local_435 = encode_flags == 0 && decode_level == qpdf_dl_none;
  *_decode_level_local = (bool)((local_435 ^ 0xffU) & 1);
  local_69 = true;
  if ((*_decode_level_local & 1U) != 0) {
    bVar3 = filterable(this,(vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                             *)local_58,(bool *)((long)&filter + 7),(bool *)((long)&filter + 6));
    *_decode_level_local = bVar3;
    if (((int)decode_level < 3) && ((filter._6_1_ & 1) != 0)) {
      *_decode_level_local = false;
    }
    if (((int)decode_level < 2) && ((filter._7_1_ & 1) != 0)) {
      *_decode_level_local = false;
    }
    if ((*_decode_level_local & 1U) == 0) {
      local_43c = 0;
    }
    else {
      if ((filter._6_1_ & 1) == 0) {
        local_440 = 3;
        if ((filter._7_1_ & 1) != 0) {
          local_440 = 2;
        }
      }
      else {
        local_440 = 1;
      }
      local_43c = local_440;
    }
    QTC::TC("qpdf","QPDF_Stream special filters",local_43c);
  }
  if (filterp_local == (bool *)0x0) {
    QTC::TC("qpdf","QPDF_Stream pipeStreamData with null pipeline",0);
    this_local._7_1_ = *_decode_level_local & 1;
  }
  else {
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::vector
              ((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)
               &normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<ContentNormalizer>::shared_ptr
              ((shared_ptr<ContentNormalizer> *)
               &new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)local_b8);
    if ((*_decode_level_local & 1U) != 0) {
      if ((encode_flags & 1U) != 0) {
        local_cc = 1;
        std::make_shared<Pl_Flate,char_const(&)[16],Pipeline*&,Pl_Flate::action_e>
                  ((char (*) [16])&local_c8,(Pipeline **)"compress stream",
                   (action_e *)&filterp_local);
        std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_b8,&local_c8);
        std::shared_ptr<Pl_Flate>::~shared_ptr(&local_c8);
        std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
        push_back((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)
                  &normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(shared_ptr<Pipeline> *)local_b8);
        filterp_local =
             (bool *)std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
      }
      if ((encode_flags & 2U) != 0) {
        std::make_shared<ContentNormalizer>();
        this_00 = &new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        std::shared_ptr<ContentNormalizer>::operator=
                  ((shared_ptr<ContentNormalizer> *)this_00,&local_e0);
        std::shared_ptr<ContentNormalizer>::~shared_ptr(&local_e0);
        iter.current._M_current =
             (__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>
              )std::__shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        std::make_shared<Pl_QPDFTokenizer,char_const(&)[11],ContentNormalizer*,Pipeline*&>
                  ((char (*) [11])&local_f0,(ContentNormalizer **)"normalizer",(Pipeline **)&iter);
        std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_b8,&local_f0);
        std::shared_ptr<Pl_QPDFTokenizer>::~shared_ptr(&local_f0);
        std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
        push_back((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)
                  &normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(shared_ptr<Pipeline> *)local_b8);
        filterp_local =
             (bool *)std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
      }
      std::
      vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
      ::rbegin((vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
                *)(local_108 + 8));
      while( true ) {
        std::
        vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
        ::rend((vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
                *)local_108);
        bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>_>
                                 *)(local_108 + 8),
                                (reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>_>
                                 *)local_108);
        if (!bVar3) break;
        this_01 = &std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>_>
                                *)(local_108 + 8))->
                   super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>;
        f_iter.current._M_current =
             (__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>
              )std::__shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>::get
                         (this_01);
        std::
        make_shared<Pl_QPDFTokenizer,char_const(&)[13],QPDFObjectHandle::TokenFilter*,Pipeline*&>
                  ((char (*) [13])&stack0xfffffffffffffee8,(TokenFilter **)"token filter",
                   (Pipeline **)&f_iter);
        std::shared_ptr<Pipeline>::operator=
                  ((shared_ptr<Pipeline> *)local_b8,
                   (shared_ptr<Pl_QPDFTokenizer> *)&stack0xfffffffffffffee8);
        std::shared_ptr<Pl_QPDFTokenizer>::~shared_ptr
                  ((shared_ptr<Pl_QPDFTokenizer> *)&stack0xfffffffffffffee8);
        std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
        push_back((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)
                  &normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(shared_ptr<Pipeline> *)local_b8);
        filterp_local =
             (bool *)std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_*,_std::vector<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>_>_>
                      *)(local_108 + 8));
      }
      std::
      vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
      ::rbegin((vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                *)local_128);
      while( true ) {
        std::
        vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
        ::rend((vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                *)&decode_pipeline);
        bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>_>
                                 *)local_128,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>_>
                                 *)&decode_pipeline);
        if (!bVar3) break;
        this_02 = (__shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>_>
                                *)local_128);
        peVar5 = std::
                 __shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_02);
        iVar4 = (*peVar5->_vptr_QPDFStreamFilter[3])(peVar5,filterp_local);
        flate = (Pl_Flate *)CONCAT44(extraout_var,iVar4);
        if (flate != (Pl_Flate *)0x0) {
          filterp_local = (bool *)flate;
        }
        if (filterp_local == (bool *)0x0) {
          local_4c8 = (Pl_Flate *)0x0;
        }
        else {
          local_4c8 = (Pl_Flate *)
                      __dynamic_cast(filterp_local,&Pipeline::typeinfo,&Pl_Flate::typeinfo,0);
        }
        local_140 = local_4c8;
        if (local_4c8 != (Pl_Flate *)0x0) {
          count.m._M_t.
          super___uniq_ptr_impl<Pl_Count::Members,_std::default_delete<Pl_Count::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Count::Members_*,_std::default_delete<Pl_Count::Members>_>.
          super__Head_base<0UL,_Pl_Count::Members_*,_false>._M_head_impl =
               (__uniq_ptr_data<Pl_Count::Members,_std::default_delete<Pl_Count::Members>,_true,_true>
                )(__uniq_ptr_data<Pl_Count::Members,_std::default_delete<Pl_Count::Members>,_true,_true>
                  )this;
          std::function<void(char_const*,int)>::
          function<qpdf::Stream::pipeStreamData(Pipeline*,bool*,int,qpdf_stream_decode_level_e,bool,bool)::__0,void>
                    ((function<void(char_const*,int)> *)&local_160,
                     (anon_class_8_1_8991fb9c *)&count.m);
          Pl_Flate::setWarnCallback(local_4c8,&local_160);
          std::function<void_(const_char_*,_int)>::~function(&local_160);
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<QPDFStreamFilter>_*,_std::vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>_>_>
                      *)local_128);
      }
    }
    peVar6 = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)
                        (filters.
                         super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    if (peVar6 == (element_type *)0x0) {
      peVar10 = std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ::get((__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                       *)(filters.
                          super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      if (peVar10 == (element_type *)0x0) {
        peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
        qVar13 = QPDFObject::getParsedOffset(peVar12);
        if (qVar13 == 0) {
          QTC::TC("qpdf","QPDF_Stream pipe no stream data",0);
          this_04 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_04,"pipeStreamData called for stream with no data");
          __cxa_throw(this_04,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        QTC::TC("qpdf","QPDF_Stream pipe original stream data",0);
        peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
        qpdf = QPDFObject::getQPDF(peVar12);
        peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
        local_390 = QPDFObject::getObjGen(peVar12);
        peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
        qVar13 = QPDFObject::getParsedOffset(peVar12);
        length = filters.
                 super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                 super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        QPDFObjectHandle::QPDFObjectHandle
                  (&local_3a0,
                   (QPDFObjectHandle *)
                   &((filters.
                      super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
        bVar3 = isRootMetadata(this);
        bVar3 = QPDF::Pipe::pipeStreamData
                          (qpdf,local_390,qVar13,(size_t)length,&local_3a0,bVar3,
                           (Pipeline *)filterp_local,suppress_warnings,will_retry);
        QPDFObjectHandle::~QPDFObjectHandle(&local_3a0);
        local_69 = ((bVar3 ^ 0xffU) & 1) != 0;
        if (local_69) {
          *_decode_level_local = false;
        }
        local_69 = !local_69;
      }
      else {
        Pl_Count::Pl_Count((Pl_Count *)local_1a0,"stream provider count",(Pipeline *)filterp_local);
        peVar11 = std::
                  __shared_ptr_access<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)(filters.
                                   super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        bVar3 = QPDFObjectHandle::StreamDataProvider::supportsRetry(peVar11);
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(filters.
                                     super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
          peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
          local_1a8 = QPDFObject::getObjGen(peVar12);
          iVar4 = (*peVar11->_vptr_StreamDataProvider[3])
                            (peVar11,&local_1a8,local_1a0,(ulong)(suppress_warnings & 1),
                             (ulong)(will_retry & 1));
          local_69 = (((byte)iVar4 ^ 0xff) & 1) != 0;
          if (local_69) {
            *_decode_level_local = false;
          }
          local_69 = !local_69;
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(filters.
                                     super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
          peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
          actual_length = (qpdf_offset_t)QPDFObject::getObjGen(peVar12);
          (*peVar11->_vptr_StreamDataProvider[2])(peVar11,&actual_length,local_1a0);
        }
        desired_length = Pl_Count::getCount((Pl_Count *)local_1a0);
        local_1c0 = 0;
        local_1e2 = 0;
        local_1e3 = 0;
        local_529 = false;
        if (local_69 != false) {
          p_Var1 = &(filters.
                     super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
          std::allocator<char>::allocator();
          local_1e2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e0,"/Length",&local_1e1);
          local_1e3 = 1;
          local_529 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&p_Var1->_M_refcount,&local_1e0);
        }
        if ((local_1e3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1e0);
        }
        if ((local_1e2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_1e1);
        }
        if (local_529 == false) {
          if (local_69 != false) {
            QTC::TC("qpdf","QPDF_Stream provider length not provided",0);
            p_Var1 = &(filters.
                       super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                      super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_370,"/Length",&local_371);
            QPDFObjectHandle::newInteger(&local_388,desired_length);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)&p_Var1->_M_refcount,&local_370,&local_388);
            QPDFObjectHandle::~QPDFObjectHandle(&local_388);
            std::__cxx11::string::~string((string *)&local_370);
            std::allocator<char>::~allocator(&local_371);
          }
        }
        else {
          p_Var1 = &(filters.
                     super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_218,"/Length",&local_219);
          QPDFObjectHandle::getKey(&local_1f8,(string *)&p_Var1->_M_refcount);
          local_1c0 = QPDFObjectHandle::getIntValue(&local_1f8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_1f8);
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator(&local_219);
          if (desired_length != local_1c0) {
            QTC::TC("qpdf","QPDF_Stream provider length mismatch",0);
            local_349 = 1;
            this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
            peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            local_308 = QPDFObject::getObjGen(peVar12);
            QPDFObjGen::unparse_abi_cxx11_(&local_300,&local_308,' ');
            std::operator+(&local_2e0,"stream data provider for ",&local_300);
            std::operator+(&local_2c0,&local_2e0," provided ");
            std::__cxx11::to_string(&local_328,desired_length);
            std::operator+(&local_2a0,&local_2c0,&local_328);
            std::operator+(&local_280,&local_2a0," bytes instead of expected ");
            std::__cxx11::to_string(&local_348,local_1c0);
            std::operator+(&local_260,&local_280,&local_348);
            std::operator+(&local_240,&local_260," bytes");
            std::runtime_error::runtime_error(this_03,(string *)&local_240);
            local_349 = 0;
            __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          QTC::TC("qpdf","QPDF_Stream pipe use stream provider",0);
        }
        Pl_Count::~Pl_Count((Pl_Count *)local_1a0);
      }
    }
    else {
      QTC::TC("qpdf","QPDF_Stream pipe replaced stream data",0);
      pbVar2 = filterp_local;
      peVar7 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          (filters.
                           super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      puVar8 = Buffer::getBuffer(peVar7);
      peVar7 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          (filters.
                           super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      sVar9 = Buffer::getSize(peVar7);
      (**(code **)(*(long *)pbVar2 + 0x10))(pbVar2,puVar8,sVar9);
      (**(code **)(*(long *)filterp_local + 0x18))();
    }
    if ((((*_decode_level_local & 1U) != 0) && (!suppress_warnings)) &&
       (peVar14 = std::__shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount), peVar14 != (element_type *)0x0)) {
      peVar15 = std::
                __shared_ptr_access<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
      bVar3 = ContentNormalizer::anyBadTokens(peVar15);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c0,"content normalization encountered bad tokens",&local_3c1);
        warn(this,&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::allocator<char>::~allocator(&local_3c1);
        peVar15 = std::
                  __shared_ptr_access<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&new_pipeline.
                                 super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        bVar3 = ContentNormalizer::lastTokenWasBad(peVar15);
        if (bVar3) {
          QTC::TC("qpdf","QPDF_Stream bad token at end during normalize",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,
                     "normalized content ended with a bad token; you may be able to resolve this by coalescing content streams in combination with normalizing content. From the command line, specify --coalesce-contents"
                     ,&local_3e9);
          warn(this,&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,
                   "Resulting stream data may be corrupted but is may still useful for manual inspection. For more information on this warning, search for content normalization in the manual."
                   ,&local_411);
        warn(this,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator(&local_411);
      }
    }
    this_local._7_1_ = local_69;
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_b8);
    std::shared_ptr<ContentNormalizer>::~shared_ptr
              ((shared_ptr<ContentNormalizer> *)
               &new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
              ((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)
               &normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>::
  ~vector((vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
           *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
Stream::pipeStreamData(
    Pipeline* pipeline,
    bool* filterp,
    int encode_flags,
    qpdf_stream_decode_level_e decode_level,
    bool suppress_warnings,
    bool will_retry)
{
    auto s = stream();
    std::vector<std::shared_ptr<QPDFStreamFilter>> filters;
    bool specialized_compression = false;
    bool lossy_compression = false;
    bool ignored;
    if (filterp == nullptr) {
        filterp = &ignored;
    }
    bool& filter = *filterp;
    filter = (!((encode_flags == 0) && (decode_level == qpdf_dl_none)));
    bool success = true;
    if (filter) {
        filter = filterable(filters, specialized_compression, lossy_compression);
        if ((decode_level < qpdf_dl_all) && lossy_compression) {
            filter = false;
        }
        if ((decode_level < qpdf_dl_specialized) && specialized_compression) {
            filter = false;
        }
        QTC::TC(
            "qpdf",
            "QPDF_Stream special filters",
            (!filter)                     ? 0
                : lossy_compression       ? 1
                : specialized_compression ? 2
                                          : 3);
    }

    if (pipeline == nullptr) {
        QTC::TC("qpdf", "QPDF_Stream pipeStreamData with null pipeline");
        // Return value is whether we can filter in this case.
        return filter;
    }

    // Construct the pipeline in reverse order. Force pipelines we create to be deleted when this
    // function finishes. Pipelines created by QPDFStreamFilter objects will be deleted by those
    // objects.
    std::vector<std::shared_ptr<Pipeline>> to_delete;

    std::shared_ptr<ContentNormalizer> normalizer;
    std::shared_ptr<Pipeline> new_pipeline;
    if (filter) {
        if (encode_flags & qpdf_ef_compress) {
            new_pipeline =
                std::make_shared<Pl_Flate>("compress stream", pipeline, Pl_Flate::a_deflate);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        if (encode_flags & qpdf_ef_normalize) {
            normalizer = std::make_shared<ContentNormalizer>();
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("normalizer", normalizer.get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto iter = s->token_filters.rbegin(); iter != s->token_filters.rend(); ++iter) {
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("token filter", (*iter).get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto f_iter = filters.rbegin(); f_iter != filters.rend(); ++f_iter) {
            auto decode_pipeline = (*f_iter)->getDecodePipeline(pipeline);
            if (decode_pipeline) {
                pipeline = decode_pipeline;
            }
            auto* flate = dynamic_cast<Pl_Flate*>(pipeline);
            if (flate != nullptr) {
                flate->setWarnCallback([this](char const* msg, int code) { warn(msg); });
            }
        }
    }

    if (s->stream_data.get()) {
        QTC::TC("qpdf", "QPDF_Stream pipe replaced stream data");
        pipeline->write(s->stream_data->getBuffer(), s->stream_data->getSize());
        pipeline->finish();
    } else if (s->stream_provider.get()) {
        Pl_Count count("stream provider count", pipeline);
        if (s->stream_provider->supportsRetry()) {
            if (!s->stream_provider->provideStreamData(
                    obj->getObjGen(), &count, suppress_warnings, will_retry)) {
                filter = false;
                success = false;
            }
        } else {
            s->stream_provider->provideStreamData(obj->getObjGen(), &count);
        }
        qpdf_offset_t actual_length = count.getCount();
        qpdf_offset_t desired_length = 0;
        if (success && s->stream_dict.hasKey("/Length")) {
            desired_length = s->stream_dict.getKey("/Length").getIntValue();
            if (actual_length == desired_length) {
                QTC::TC("qpdf", "QPDF_Stream pipe use stream provider");
            } else {
                QTC::TC("qpdf", "QPDF_Stream provider length mismatch");
                // This would be caused by programmer error on the part of a library user, not by
                // invalid input data.
                throw std::runtime_error(
                    "stream data provider for " + obj->getObjGen().unparse(' ') + " provided " +
                    std::to_string(actual_length) + " bytes instead of expected " +
                    std::to_string(desired_length) + " bytes");
            }
        } else if (success) {
            QTC::TC("qpdf", "QPDF_Stream provider length not provided");
            s->stream_dict.replaceKey("/Length", QPDFObjectHandle::newInteger(actual_length));
        }
    } else if (obj->getParsedOffset() == 0) {
        QTC::TC("qpdf", "QPDF_Stream pipe no stream data");
        throw std::logic_error("pipeStreamData called for stream with no data");
    } else {
        QTC::TC("qpdf", "QPDF_Stream pipe original stream data");
        if (!QPDF::Pipe::pipeStreamData(
                obj->getQPDF(),
                obj->getObjGen(),
                obj->getParsedOffset(),
                s->length,
                s->stream_dict,
                isRootMetadata(),
                pipeline,
                suppress_warnings,
                will_retry)) {
            filter = false;
            success = false;
        }
    }

    if (filter && (!suppress_warnings) && normalizer.get() && normalizer->anyBadTokens()) {
        warn("content normalization encountered bad tokens");
        if (normalizer->lastTokenWasBad()) {
            QTC::TC("qpdf", "QPDF_Stream bad token at end during normalize");
            warn(
                "normalized content ended with a bad token; you may be able to resolve this by "
                "coalescing content streams in combination with normalizing content. From the "
                "command line, specify --coalesce-contents");
        }
        warn(
            "Resulting stream data may be corrupted but is may still useful for manual "
            "inspection. For more information on this warning, search for content normalization "
            "in the manual.");
    }

    return success;
}